

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void standard_palette_init(standard_display *dp)

{
  png_store *ps;
  png_store_file *ppVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  store_palette_entry *__src;
  ulong uVar5;
  
  ps = dp->ps;
  ppVar1 = ps->current;
  if (ppVar1 == (png_store_file *)0x0) {
    store_log(ps,ps->pread,"no current stream for palette",1);
    uVar3 = dp->npalette;
    __src = (store_palette_entry *)0x0;
  }
  else {
    uVar3 = ppVar1->npalette;
    dp->npalette = uVar3;
    __src = ppVar1->palette;
  }
  if (0 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
    memcpy(dp->palette,__src,uVar5 * 4);
    iVar4 = 1;
    do {
      if ((long)uVar5 < 1) {
        iVar4 = 0;
        break;
      }
      lVar2 = uVar5 - 1;
      uVar5 = uVar5 - 1;
    } while (__src[lVar2].alpha == 0xff);
    dp->is_transparent = iVar4;
  }
  return;
}

Assistant:

static void
standard_palette_init(standard_display *dp)
{
   store_palette_entry *palette = store_current_palette(dp->ps, &dp->npalette);

   /* The remaining entries remain white/opaque. */
   if (dp->npalette > 0)
   {
      int i = dp->npalette;
      memcpy(dp->palette, palette, i * sizeof *palette);

      /* Check for a non-opaque palette entry: */
      while (--i >= 0)
         if (palette[i].alpha < 255)
            break;

#     ifdef __GNUC__
         /* GCC can't handle the more obviously optimizable version. */
         if (i >= 0)
            dp->is_transparent = 1;
         else
            dp->is_transparent = 0;
#     else
         dp->is_transparent = (i >= 0);
#     endif
   }
}